

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::SaveTo(Builder *this,Version *v)

{
  bool bVar1;
  Version *in_RSI;
  BySmallestKey in_RDI;
  const_iterator bpos;
  FileMetaData **added_file;
  iterator __end3;
  iterator __begin3;
  FileSet *__range3;
  FileSet *added_files;
  const_iterator base_end;
  const_iterator base_iter;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *base_files;
  int level;
  BySmallestKey cmp;
  Version *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Version *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *__val;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  in_stack_ffffffffffffff80;
  _Self local_58;
  _Self local_50;
  undefined8 local_48;
  undefined8 local_40;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_38;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_30;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_28;
  int local_1c;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_18;
  Version *local_10;
  
  local_18._M_current =
       (FileMetaData **)(((in_RDI.internal_comparator)->super_Comparator)._vptr_Comparator + 7);
  local_10 = in_RSI;
  for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
    local_28 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               ((in_RDI.internal_comparator)->user_comparator_ + (long)local_1c * 3 + 4);
    local_30._M_current =
         (FileMetaData **)
         std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::begin
                   ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    in_stack_ffffffffffffff48);
    local_38._M_current =
         (FileMetaData **)
         std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::end
                   ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    in_stack_ffffffffffffff48);
    local_40 = *(undefined8 *)((long)in_RDI.internal_comparator + (long)local_1c * 0x38 + 0x40);
    __val = local_10->files_ + local_1c;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size(local_28);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::size((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
            *)0x12e7aa);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffff80._M_current,(size_type)in_RDI.internal_comparator);
    local_48 = local_40;
    local_50._M_node =
         (_Base_ptr)
         std::
         set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
         ::begin((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
                  *)in_stack_ffffffffffffff48);
    local_58._M_node =
         (_Base_ptr)
         std::
         set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
         ::end((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
                *)in_stack_ffffffffffffff48);
    while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator*
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)0x12e806);
      in_stack_ffffffffffffff80._M_current = local_18._M_current;
      std::
      upper_bound<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,leveldb::FileMetaData*,leveldb::VersionSet::Builder::BySmallestKey>
                (local_38,local_18,(FileMetaData **)__val,in_RDI);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                                 *)in_stack_ffffffffffffff48), bVar1) {
        in_stack_ffffffffffffff58 = local_10;
        in_stack_ffffffffffffff64 = local_1c;
        __gnu_cxx::
        __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
        ::operator*(&local_30);
        MaybeAddFile((Builder *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                     (FileMetaData *)in_stack_ffffffffffffff48);
        __gnu_cxx::
        __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
        ::operator++(&local_30);
      }
      MaybeAddFile((Builder *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   (FileMetaData *)in_stack_ffffffffffffff48);
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator++
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                               *)in_stack_ffffffffffffff48), bVar1) {
      in_stack_ffffffffffffff48 = local_10;
      in_stack_ffffffffffffff54 = local_1c;
      __gnu_cxx::
      __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
      ::operator*(&local_30);
      MaybeAddFile((Builder *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   (FileMetaData *)in_stack_ffffffffffffff48);
      __gnu_cxx::
      __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void SaveTo(Version* v) {
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      // Merge the set of added files with the set of pre-existing files.
      // Drop any deleted files.  Store the result in *v.
      const std::vector<FileMetaData*>& base_files = base_->files_[level];
      std::vector<FileMetaData*>::const_iterator base_iter = base_files.begin();
      std::vector<FileMetaData*>::const_iterator base_end = base_files.end();
      const FileSet* added_files = levels_[level].added_files;
      v->files_[level].reserve(base_files.size() + added_files->size());
      for (const auto& added_file : *added_files) {
        // Add all smaller files listed in base_
        for (std::vector<FileMetaData*>::const_iterator bpos =
                 std::upper_bound(base_iter, base_end, added_file, cmp);
             base_iter != bpos; ++base_iter) {
          MaybeAddFile(v, level, *base_iter);
        }

        MaybeAddFile(v, level, added_file);
      }

      // Add remaining base files
      for (; base_iter != base_end; ++base_iter) {
        MaybeAddFile(v, level, *base_iter);
      }

#ifndef NDEBUG
      // Make sure there is no overlap in levels > 0
      if (level > 0) {
        for (uint32_t i = 1; i < v->files_[level].size(); i++) {
          const InternalKey& prev_end = v->files_[level][i - 1]->largest;
          const InternalKey& this_begin = v->files_[level][i]->smallest;
          if (vset_->icmp_.Compare(prev_end, this_begin) >= 0) {
            fprintf(stderr, "overlapping ranges in same level %s vs. %s\n",
                    prev_end.DebugString().c_str(),
                    this_begin.DebugString().c_str());
            abort();
          }
        }
      }
#endif
    }
  }